

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

int XUtf8TextWidth(XUtf8FontStruct *font_set,char *string,int num_bytes)

{
  uint uVar1;
  XFontStruct **ppXVar2;
  uint ucs_00;
  unsigned_short uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  char glyph [2];
  uint ucs;
  XChar2b buf [128];
  undefined2 local_17a;
  int local_178;
  uint local_174;
  unsigned_short local_16e;
  int local_16c;
  ulong local_168;
  int local_160;
  uint local_15c;
  int *local_158;
  int *local_150;
  long local_148;
  uchar *local_140;
  undefined2 local_138 [132];
  
  uVar1 = font_set->nb_font;
  if (0 < (int)uVar1) {
    local_158 = font_set->ranges;
    local_150 = font_set->encodings;
    ppXVar2 = font_set->fonts;
    uVar9 = 0;
    do {
      if (ppXVar2[uVar9] != (XFontStruct *)0x0) {
        if (0 < num_bytes) {
          uVar10 = uVar9 & 0xffffffff;
          uVar7 = 0;
          iVar4 = 0;
          goto LAB_001fd03b;
        }
        uVar7 = 0;
        iVar4 = 0;
        iVar5 = (int)uVar9;
        goto LAB_001fd1e2;
      }
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  return 0;
LAB_001fd03b:
  local_178 = iVar4;
  local_160 = (int)uVar10;
  local_148 = (long)local_160;
  if (0x78 < (int)uVar7) {
    iVar4 = XTextWidth16(ppXVar2[local_148],local_138);
    local_178 = local_178 + iVar4;
    local_168 = 0;
    uVar7 = local_168;
  }
  local_168 = uVar7;
  local_140 = (uchar *)string;
  local_15c = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&local_174);
  if ((int)local_15c < 2) {
    local_15c = 1;
  }
  local_16e = XUtf8IsNonSpacing(local_174);
  if (local_16e != 0) {
    local_174 = (uint)local_16e;
  }
  ucs_00 = local_174;
  uVar10 = uVar9;
  local_16c = num_bytes;
  if ((int)uVar9 < (int)uVar1) {
    do {
      if (ppXVar2[uVar10] != (XFontStruct *)0x0) {
        iVar4 = local_150[uVar10];
        iVar5 = ucs2fontmap((char *)&local_17a,ucs_00,iVar4);
        if ((-1 < iVar5) &&
           ((iVar4 != 0 ||
            ((local_158[uVar10 * 2] <= (int)ucs_00 && ((int)ucs_00 <= local_158[uVar10 * 2 + 1])))))
           ) goto LAB_001fd114;
      }
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
LAB_001fd119:
    ucs2fontmap((char *)&local_17a,0x3f,local_150[uVar9]);
    uVar10 = uVar9 & 0xffffffff;
  }
  else {
    uVar10 = uVar9 & 0xffffffff;
LAB_001fd114:
    if ((uint)uVar10 == uVar1) goto LAB_001fd119;
  }
  uVar3 = local_16e;
  iVar5 = (int)uVar10;
  if ((local_16e == 0) && (local_160 == iVar5)) {
    local_138[(int)local_168] = local_17a;
    uVar7 = (ulong)((int)local_168 + 1);
    iVar4 = local_178;
    iVar8 = local_16c;
  }
  else {
    iVar4 = XTextWidth16(ppXVar2[local_148],local_138,local_168);
    iVar8 = local_16c;
    iVar4 = iVar4 + local_178;
    local_138[0] = local_17a;
    if (uVar3 == 0) {
      uVar7 = 1;
    }
    else {
      iVar6 = XTextWidth16(ppXVar2[iVar5],local_138,1);
      uVar7 = 1;
      iVar4 = iVar4 - iVar6;
    }
  }
  string = (char *)(local_140 + local_15c);
  num_bytes = iVar8 - local_15c;
  if (num_bytes == 0 || iVar8 < (int)local_15c) {
LAB_001fd1e2:
    iVar5 = XTextWidth16(ppXVar2[iVar5],local_138,uVar7);
    return iVar5 + iVar4;
  }
  goto LAB_001fd03b;
}

Assistant:

int
XUtf8TextWidth(XUtf8FontStruct 	*font_set,
	       const char 	*string,
	       int 		num_bytes) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** measure the buffer **/
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) {
      ucs = no_spc;
    }

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	/* go back to draw the non-spacing char over the previous char */
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  x += XTextWidth16(fonts[last_fnum], buf, i);

  return x;
}